

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O2

void __thiscall CLayerTiles::Render(CLayerTiles *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  CEditor *pCVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vec4 Color;
  vec4 Color_00;
  undefined8 local_38;
  undefined8 local_28;
  
  iVar5 = this->m_Image;
  pCVar6 = (this->super_CLayer).m_pEditor;
  if ((-1 < (long)iVar5) && (iVar5 < (pCVar6->m_Map).m_lImages.num_elements)) {
    (this->m_Texture).m_Id = ((pCVar6->m_Map).m_lImages.list[iVar5]->m_Texture).m_Id;
  }
  (*(pCVar6->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
            (pCVar6->m_pGraphics,(ulong)(uint)(this->m_Texture).m_Id);
  uVar1 = (this->m_Color).r;
  uVar3 = (this->m_Color).g;
  auVar7._0_4_ = (float)(int)uVar1;
  auVar7._4_4_ = (float)(int)uVar3;
  auVar7._8_8_ = 0;
  auVar7 = divps(auVar7,_DAT_001c9f70);
  uVar2 = (this->m_Color).b;
  uVar4 = (this->m_Color).a;
  auVar8._0_4_ = (float)(int)uVar2;
  auVar8._4_4_ = (float)(int)uVar4;
  auVar8._8_8_ = 0;
  auVar8 = divps(auVar8,_DAT_001c9f70);
  (*(((this->super_CLayer).m_pEditor)->m_pGraphics->super_IInterface)._vptr_IInterface[7])();
  pCVar6 = (this->super_CLayer).m_pEditor;
  local_28 = auVar7._0_8_;
  local_38 = auVar8._0_8_;
  Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)(undefined4)local_38;
  Color.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)local_38._4_4_;
  Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)(undefined4)local_28;
  Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)local_28._4_4_;
  CRenderTools::RenderTilemap
            (&pCVar6->m_RenderTools,this->m_pTiles,this->m_Width,this->m_Height,32.0,Color,1,
             CEditor::EnvelopeEval,pCVar6,this->m_ColorEnv,this->m_ColorEnvOffset);
  (*(((this->super_CLayer).m_pEditor)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  pCVar6 = (this->super_CLayer).m_pEditor;
  Color_00.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)(undefined4)local_38;
  Color_00.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)local_38._4_4_;
  Color_00.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)(undefined4)local_28;
  Color_00.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)local_28._4_4_;
  CRenderTools::RenderTilemap
            (&pCVar6->m_RenderTools,this->m_pTiles,this->m_Width,this->m_Height,32.0,Color_00,2,
             CEditor::EnvelopeEval,pCVar6,this->m_ColorEnv,this->m_ColorEnvOffset);
  return;
}

Assistant:

void CLayerTiles::Render()
{
	if(m_Image >= 0 && m_Image < m_pEditor->m_Map.m_lImages.size())
		m_Texture = m_pEditor->m_Map.m_lImages[m_Image]->m_Texture;
	Graphics()->TextureSet(m_Texture);
	vec4 Color = vec4(m_Color.r/255.0f, m_Color.g/255.0f, m_Color.b/255.0f, m_Color.a/255.0f);
	Graphics()->BlendNone();
	m_pEditor->RenderTools()->RenderTilemap(m_pTiles, m_Width, m_Height, 32.0f, Color, LAYERRENDERFLAG_OPAQUE,
												m_pEditor->EnvelopeEval, m_pEditor, m_ColorEnv, m_ColorEnvOffset);
	Graphics()->BlendNormal();
	m_pEditor->RenderTools()->RenderTilemap(m_pTiles, m_Width, m_Height, 32.0f, Color, LAYERRENDERFLAG_TRANSPARENT,
												m_pEditor->EnvelopeEval, m_pEditor, m_ColorEnv, m_ColorEnvOffset);
}